

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmselect.c
# Opt level: O2

void libcmselect_LTX_select_free(CMtrans_services svc,CManager_conflict cm,void *client_data)

{
  long lVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  
  lVar1 = *client_data;
  (*svc->verbose)(*(CManager *)(lVar1 + 0x40),CMFreeVerbose,"CMSelect free task called");
  if (*client_data != 0) {
    close(*(int *)(lVar1 + 0x4c));
    close(*(int *)(lVar1 + 0x50));
    pvVar2 = *client_data;
    *(undefined8 *)client_data = 0;
    pvVar4 = *(void **)((long)pvVar2 + 0x30);
    (*svc->free_func)(*(void **)((long)pvVar2 + 8));
    (*svc->free_func)(*(void **)((long)pvVar2 + 0x10));
    (*svc->free_func)(*(void **)((long)pvVar2 + 0x20));
    (*svc->free_func)(*(void **)((long)pvVar2 + 0x28));
    while (pvVar4 != (void *)0x0) {
      pvVar3 = *(void **)((long)pvVar4 + 0x38);
      (*svc->free_func)(pvVar4);
      pvVar4 = pvVar3;
    }
    (*svc->free_func)(pvVar2);
    return;
  }
  return;
}

Assistant:

extern void
libcmselect_LTX_select_free(CMtrans_services svc, CManager cm, void *client_data)
{
    select_data_ptr *sdp = client_data;
    select_data_ptr sd = *sdp;

    svc->verbose(sd->cm, CMFreeVerbose, "CMSelect free task called");

    if (*((select_data_ptr *)client_data) != NULL) {
	close(sd->wake_read_fd);
	close(sd->wake_write_fd);
	free_select_data(svc, sdp);
    }
}